

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.hpp
# Opt level: O2

void __thiscall
duckdb_jaro_winkler::common::BlockPatternMatchVector::insert<char>
          (BlockPatternMatchVector *this,int64_t block,char key,int pos)

{
  ulong *puVar1;
  uint64_t mask;
  
  mask = 1L << ((byte)pos & 0x3f);
  if (-1 < key) {
    puVar1 = (this->m_extendedAscii).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start + (ulong)(byte)key * this->m_block_count + block;
    *puVar1 = *puVar1 | mask;
    return;
  }
  BitvectorHashmap::insert_mask<char>
            ((this->m_map).
             super__Vector_base<duckdb_jaro_winkler::common::BitvectorHashmap,_std::allocator<duckdb_jaro_winkler::common::BitvectorHashmap>_>
             ._M_impl.super__Vector_impl_data._M_start + block,key,mask);
  return;
}

Assistant:

void insert(int64_t block, CharT key, int pos)
    {
        uint64_t mask = 1ull << pos;

        assert(block < m_block_count);
        if (key >= 0 && key <= 255) {
            m_extendedAscii[static_cast<size_t>(key * m_block_count + block)] |= mask;
        }
        else {
            m_map[static_cast<size_t>(block)].insert_mask(key, mask);
        }
    }